

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::SchemaParser::ModuleImpl> * __thiscall
kj::Own<capnp::SchemaParser::ModuleImpl>::operator=
          (Own<capnp::SchemaParser::ModuleImpl> *this,Own<capnp::SchemaParser::ModuleImpl> *other)

{
  ModuleImpl *object;
  ModuleImpl *this_00;
  ModuleImpl *pMVar1;
  Disposer *in_RDX;
  
  object = (ModuleImpl *)this->disposer;
  this_00 = this->ptr;
  pMVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pMVar1;
  other->ptr = (ModuleImpl *)0x0;
  if (this_00 != (ModuleImpl *)0x0) {
    Disposer::Dispose_<capnp::SchemaParser::ModuleImpl,_true>::dispose
              ((Dispose_<capnp::SchemaParser::ModuleImpl,_true> *)this_00,object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }